

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_channels.cpp
# Opt level: O1

void __thiscall ON_RenderChannels::ON_RenderChannels(ON_RenderChannels *this,ON_RenderChannels *rch)

{
  CImpl *pCVar1;
  
  this->_vptr_ON_RenderChannels = (_func_int **)&PTR__ON_RenderChannels_00827608;
  pCVar1 = (CImpl *)operator_new(0x40);
  *(undefined8 *)
   ((long)&(pCVar1->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex + 0x10) =
       0;
  (pCVar1->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  (pCVar1->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(pCVar1->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex + 8) = 0;
  (pCVar1->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  (pCVar1->super_ON_InternalXMLImpl)._mutex.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  (pCVar1->super_ON_InternalXMLImpl)._local_node = (ON_XMLNode *)0x0;
  (pCVar1->super_ON_InternalXMLImpl)._model_node = (ON_XMLNode *)0x0;
  (pCVar1->super_ON_InternalXMLImpl)._vptr_ON_InternalXMLImpl =
       (_func_int **)&PTR__ON_InternalXMLImpl_00827680;
  this->m_impl = pCVar1;
  operator=(this,rch);
  return;
}

Assistant:

ON_RenderChannels::ON_RenderChannels(const ON_RenderChannels& rch)
{
  m_impl = new CImpl;
  operator = (rch);
}